

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

char * google::protobuf::internal::PackedEnumParserArg
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_void_ptr_int *is_valid,
                 void *data,InternalMetadataWithArena *metadata,int field_num)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  void *pvVar4;
  bool bVar5;
  byte *pbVar6;
  int iVar7;
  byte *ptr_00;
  uint uVar8;
  uint32 res32;
  int iVar9;
  UnknownFieldSet *this;
  pair<const_char_*,_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  pair<const_char_*,_bool> pVar12;
  
  bVar1 = *ptr;
  uVar8 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar10 = ReadSizeFallback(ptr,(uint)bVar1);
    uVar8 = pVar10.second;
    ptr_00 = (byte *)pVar10.first;
    if (ptr_00 == (byte *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    ptr_00 = (byte *)(ptr + 1);
  }
  pcVar3 = (ctx->super_EpsCopyInputStream).buffer_end_;
  uVar8 = ((int)ptr_00 - (int)pcVar3) + uVar8;
  pbVar6 = (byte *)(pcVar3 + (int)((int)uVar8 >> 0x1f & uVar8));
  (ctx->super_EpsCopyInputStream).limit_end_ = (char *)pbVar6;
  iVar7 = (ctx->super_EpsCopyInputStream).limit_;
  (ctx->super_EpsCopyInputStream).limit_ = uVar8;
  iVar7 = iVar7 - uVar8;
  if (-1 < iVar7) {
    while (ptr_00 < pbVar6) {
LAB_0016fd39:
      bVar1 = *ptr_00;
      pVar11.second = (long)(char)bVar1;
      pVar11.first = (char *)(ptr_00 + 1);
      if ((long)(char)bVar1 < 0) {
        bVar2 = ptr_00[1];
        res32 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar11 = VarintParseSlow64((char *)ptr_00,res32);
          if (pVar11.first == (char *)0x0) {
            return (char *)0x0;
          }
        }
        else {
          pVar11.second._0_4_ = res32;
          pVar11.first = (char *)(ptr_00 + 2);
          pVar11.second._4_4_ = 0;
        }
      }
      ptr_00 = (byte *)pVar11.first;
      bVar5 = (*is_valid)(data,(int)pVar11.second);
      if (bVar5) {
        iVar9 = *object;
        if (iVar9 == *(int *)((long)object + 4)) {
          RepeatedField<int>::Reserve((RepeatedField<int> *)object,iVar9 + 1);
          iVar9 = *object;
        }
        *(int *)object = iVar9 + 1;
        *(int *)(*(long *)((long)object + 8) + (long)iVar9 * 4) = (int)pVar11.second;
      }
      else {
        pvVar4 = (metadata->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          this = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           (&metadata->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           );
        }
        else {
          this = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        UnknownFieldSet::AddVarint(this,field_num,pVar11.second);
      }
      pbVar6 = (byte *)(ctx->super_EpsCopyInputStream).limit_end_;
    }
    if ((long)ptr_00 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
        (long)(ctx->super_EpsCopyInputStream).limit_) {
      pVar12 = EpsCopyInputStream::DoneFallback(&ctx->super_EpsCopyInputStream,(char *)ptr_00,-1);
      ptr_00 = (byte *)pVar12.first;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0016fd39;
    }
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      uVar8 = iVar7 + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar8;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar8 >> 0x1f & uVar8);
      return (char *)ptr_00;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* PackedEnumParserArg(void* object, const char* ptr,
                                ParseContext* ctx,
                                bool (*is_valid)(const void*, int),
                                const void* data,
                                InternalMetadataWithArena* metadata,
                                int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, data, metadata, field_num](uint64 val) {
        if (is_valid(data, val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}